

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
* __thiscall
Lib::
iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
          (IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
           *__return_storage_ptr__,Lib *this,
          Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *p)

{
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_28;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_18;
  
  local_18._self._M_t.
  super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator>_>
  .
  super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator_*,_false>
  ._M_head_impl =
       *(__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator>,_true,_true>
         *)this;
  *(undefined8 *)this = 0;
  local_28._self._M_t.
  super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator>_>
  ._M_t.
  super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator>_>
  .
  super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator>,_true,_true>
        )(__uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator>_>
          )0x0;
  iterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>
            (__return_storage_ptr__,(Lib *)&local_18,
             (IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
              *)p);
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_18);
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto iterPointer(P p) { return iterTraits(IterPointer<P>(std::move(p))); }